

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

bool goodform::json::deserialize(istream *input,any *v)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  double tmp;
  char drain [5];
  string str_number;
  string s;
  double dStack_1e8;
  undefined1 local_1dd [5];
  undefined1 *local_1d8;
  undefined8 local_1d0;
  undefined1 local_1c8;
  undefined7 uStack_1c7;
  string local_1b8 [4];
  ios_base local_138 [264];
  
  strip_white_space(input);
  bVar1 = std::istream::peek();
  if (bVar1 == 0x22) {
    local_1b8[0]._M_string_length = 0;
    local_1b8[0].field_2._M_local_buf[0] = '\0';
    local_1b8[0]._M_dataplus._M_p = (pointer)&local_1b8[0].field_2;
    bVar2 = read_string(input,local_1b8);
    std::any::operator=(v,local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
      operator_delete(local_1b8[0]._M_dataplus._M_p,
                      CONCAT71(local_1b8[0].field_2._M_allocated_capacity._1_7_,
                               local_1b8[0].field_2._M_local_buf[0]) + 1);
      return bVar2;
    }
    return bVar2;
  }
  if (bVar1 == 0x5b) {
    bVar2 = parse_array(input,v);
    return bVar2;
  }
  if (bVar1 == 0x7b) {
    bVar2 = parse_object(input,v);
    return bVar2;
  }
  if ((bVar1 == 0x2d) || ((int)(char)bVar1 - 0x30U < 10)) {
    local_1d0 = 0;
    local_1c8 = 0;
    local_1d8 = &local_1c8;
    std::__cxx11::string::push_back((char)&local_1d8);
    std::istream::seekg((long)input,_S_cur);
    bVar2 = false;
    while (*(int *)(input + *(long *)(*(long *)input + -0x18) + 0x20) == 0) {
      bVar3 = std::istream::peek();
      bVar2 = (bool)(bVar2 | bVar3 == 0x2e);
      if ((((bVar3 != 0x2e) && (bVar3 != 0x2b)) && (bVar3 != 0x2d)) &&
         (((bVar3 & 0xdf) != 0x45 && (9 < (int)(char)bVar3 - 0x30U)))) break;
      std::__cxx11::string::push_back((char)&local_1d8);
      std::istream::seekg((long)input,_S_cur);
    }
    std::__cxx11::stringstream::stringstream
              ((stringstream *)local_1b8,(string *)&local_1d8,_S_out|_S_in);
    if (bVar2) {
      std::istream::_M_extract<double>((double *)local_1b8);
      std::any::operator=(v,&dStack_1e8);
    }
    else if (bVar1 == 0x2d) {
      std::istream::_M_extract<long>((long *)local_1b8);
      std::any::operator=(v,(long *)&dStack_1e8);
    }
    else {
      std::istream::_M_extract<unsigned_long>((ulong *)local_1b8);
      std::any::operator=(v,(unsigned_long *)&dStack_1e8);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,CONCAT71(uStack_1c7,local_1c8) + 1);
    }
  }
  else {
    bVar1 = bVar1 & 0xdf;
    if (bVar1 == 0x46) {
      std::istream::read((char *)input,(long)local_1dd);
      local_1b8[0]._M_dataplus._M_p = local_1b8[0]._M_dataplus._M_p & 0xffffffffffffff00;
    }
    else {
      if (bVar1 == 0x4e) {
        std::istream::read((char *)input,(long)local_1dd);
        local_1b8[0]._M_dataplus._M_p = (pointer)0x0;
        std::any::operator=(v,(void **)local_1b8);
        return true;
      }
      if (bVar1 != 0x54) {
        return false;
      }
      std::istream::read((char *)input,(long)local_1dd);
      local_1b8[0]._M_dataplus._M_p._0_1_ = 1;
    }
    std::any::operator=(v,(bool *)local_1b8);
  }
  return true;
}

Assistant:

bool json::deserialize(std::istream& input, any& v)
  {
    bool ret = false;

    char drain[5];

    strip_white_space(input);

    char c = (char)input.peek();
    if (c == '{')
    {
      ret = parse_object(input, v);
    }
    else if (c == '[')
    {
      ret = parse_array(input, v);
    }
    else if (c == '"')
    {
      std::string s;
      ret = read_string(input, s);
      v = std::move(s);
    }
    else if (isdigit(c) || c == '-')
    {
      bool is_signed = (c == '-');

      std::string str_number;
      str_number += c;
      input.seekg(1, std::ios::cur);
      bool done = false;
      bool found_period = false;
      while (!done && input.good())
      {
        c = (char)input.peek();

        if (c == '.')
          found_period = true;

        if (isdigit(c) || c == '.' || c == 'e' || c == 'E' || c == '-' || c == '+')
        {
          str_number += c;
          input.seekg(1, std::ios::cur);
        }
        else
        {
          done = true;
        }
      }

      std::stringstream ss(str_number);
      if (found_period)
      {
        double tmp;
        ss >> tmp;
        v = (tmp);
      }
      else if (is_signed)
      {
        std::int64_t tmp;
        ss >> tmp;
        v = (tmp);
      }
      else
      {
        std::uint64_t tmp;
        ss >> tmp;
        v = (tmp);
      }

      ret = true;
    }
    else if (c == 't' || c == 'T')
    {
      input.read(drain, 4);
      v = (true);
      ret = true;
    }
    else if (c == 'f' || c == 'F')
    {
      input.read(drain, 5);
      v = (false);
      ret = true;
    }
    else if (c == 'n' || c == 'N')
    {
      input.read(drain, 4);
      v = (nullptr);
      ret = true;
    }

    return ret;
  }